

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModule.h
# Opt level: O0

void __thiscall
TObjectConstructorConcrete<TActual<TestSharedPtrObj>_>::DeRegister
          (TObjectConstructorConcrete<TActual<TestSharedPtrObj>_> *this,PerTypeObjectId id)

{
  size_type sVar1;
  reference ppIVar2;
  PerTypeObjectId local_18;
  PerTypeObjectId id_local;
  TObjectConstructorConcrete<TActual<TestSharedPtrObj>_> *this_local;
  
  local_18 = id;
  id_local = (PerTypeObjectId)this;
  sVar1 = std::vector<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>::size
                    (&this->m_ConstructedObjects);
  if (sVar1 - 1 == local_18) {
    std::vector<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>::pop_back
              (&this->m_ConstructedObjects);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->m_FreeIds,&local_18);
    ppIVar2 = std::vector<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>::operator[]
                        (&this->m_ConstructedObjects,local_18);
    *ppIVar2 = (value_type)0x0;
  }
  return;
}

Assistant:

void DeRegister( PerTypeObjectId id )
    {
        //remove from constructed objects.
        //use swap with last one
        if( m_ConstructedObjects.size() - 1 == id )
        {
            //it's the last one, just remove it.
            m_ConstructedObjects.pop_back();
        }
        else
        {
            m_FreeIds.push_back( id );
            m_ConstructedObjects[ id ] = 0;
        }
    }